

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O2

void aom_quantize_b_32x32_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [12];
  int i;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int16_t *piVar12;
  ulong uVar13;
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  tran_low_t *ptVar14;
  __m128i *qcoeff1;
  __m128i *qcoeff0;
  int *piVar15;
  __m128i *palVar16;
  long lVar17;
  long lVar18;
  short sVar19;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar20 [16];
  short sVar31;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  ushort uVar42;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  undefined1 auVar44 [16];
  ushort uVar62;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar70;
  short sVar71;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i mask;
  __m128i mask_00;
  __m128i dequant;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i zero;
  __m128i zero_00;
  __m128i zero_01;
  __m128i zero_02;
  undefined4 uStack_178;
  int is_found0;
  uint local_170;
  int log_scale;
  undefined1 local_168 [16];
  undefined1 local_158 [4];
  undefined4 uStack_154;
  undefined4 uStack_150;
  ushort uStack_14c;
  ushort uStack_14a;
  undefined1 local_148 [8];
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [16];
  undefined8 local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  int thresh [4];
  undefined1 local_b8 [4];
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  __m128i mask0;
  undefined1 local_98 [4];
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  intptr_t local_80;
  undefined1 local_78 [16];
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  __m128i threshold [2];
  longlong extraout_RDX_00;
  longlong extraout_RDX_02;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar43;
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  short sVar63;
  
  log_scale = 1;
  is_found0 = 0;
  mask0[0] = 0;
  mask0[1] = 0;
  auVar32 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar20 = ZEXT416(*(uint *)zbin_ptr) & _DAT_0046fda0;
  auVar44._0_2_ = auVar20._0_2_ + auVar32._0_2_;
  auVar44._2_2_ = auVar20._2_2_ + auVar32._2_2_;
  auVar44._4_2_ = auVar32._4_2_;
  auVar44._6_2_ = auVar32._6_2_;
  auVar44._8_2_ = auVar20._8_2_ + auVar32._8_2_;
  auVar44._10_2_ = auVar20._10_2_ + auVar32._10_2_;
  auVar44._12_2_ = auVar20._12_2_ + auVar32._12_2_;
  auVar44._14_2_ = auVar20._14_2_ + auVar32._14_2_;
  auVar20 = pshuflw(auVar44,auVar44,0x60);
  local_120 = CONCAT44(auVar20._4_4_ >> 0x10,auVar20._0_4_ >> 0x10);
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    thresh[lVar10] =
         (dequant_ptr[lVar10] * 0x145 + 0x40 >> 7) + *(int *)(local_118 + lVar10 * 4 + -8) * 0x20 +
         -1;
  }
  thresh[3] = thresh[1];
  thresh[2] = thresh[1];
  auVar6._4_4_ = thresh[1];
  auVar6._0_4_ = thresh[1];
  auVar6._8_4_ = thresh[1];
  local_148 = auVar6._4_8_;
  uStack_140 = thresh[1];
  uStack_13c = thresh[1];
  local_138 = *(undefined1 (*) [16])quant_ptr;
  _local_158 = *(__m128i *)dequant_ptr;
  local_d8 = *(undefined1 (*) [16])quant_shift_ptr;
  local_168._2_2_ = (ushort)(zbin_ptr[1] + 1U) >> 1;
  local_168._0_2_ = (ushort)(*zbin_ptr + 1U) >> 1;
  local_168._4_2_ = (ushort)(zbin_ptr[2] + 1U) >> 1;
  local_168._6_2_ = (ushort)(zbin_ptr[3] + 1U) >> 1;
  local_168._8_2_ = (ushort)(zbin_ptr[4] + 1U) >> 1;
  local_168._10_2_ = (ushort)(zbin_ptr[5] + 1U) >> 1;
  local_168._12_2_ = (ushort)(zbin_ptr[6] + 1U) >> 1;
  local_168._14_2_ = (ushort)(zbin_ptr[7] + 1U) >> 1;
  local_78 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  local_118 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc)
                      );
  local_e8._2_2_ = (ushort)(round_ptr[1] + 1U) >> 1;
  local_e8._0_2_ = (ushort)(*round_ptr + 1U) >> 1;
  local_e8._4_2_ = (ushort)(round_ptr[2] + 1U) >> 1;
  local_e8._6_2_ = (ushort)(round_ptr[3] + 1U) >> 1;
  local_e8._8_2_ = (ushort)(round_ptr[4] + 1U) >> 1;
  local_e8._10_2_ = (ushort)(round_ptr[5] + 1U) >> 1;
  local_e8._12_2_ = (ushort)(round_ptr[6] + 1U) >> 1;
  local_e8._14_2_ = (ushort)(round_ptr[7] + 1U) >> 1;
  sVar19 = local_78._0_2_;
  sVar70 = -sVar19;
  sVar25 = local_78._2_2_;
  sVar43 = -sVar25;
  sVar26 = local_78._4_2_;
  sVar63 = -sVar26;
  sVar27 = local_78._6_2_;
  sVar71 = -sVar27;
  sVar28 = local_78._8_2_;
  sVar2 = -sVar28;
  sVar29 = local_78._10_2_;
  sVar3 = -sVar29;
  sVar30 = local_78._12_2_;
  sVar4 = -sVar30;
  sVar31 = local_78._14_2_;
  sVar5 = -sVar31;
  local_f8._0_2_ = (ushort)(sVar70 < sVar19) * sVar19 | (ushort)(sVar70 >= sVar19) * sVar70;
  local_f8._2_2_ = (ushort)(sVar43 < sVar25) * sVar25 | (ushort)(sVar43 >= sVar25) * sVar43;
  local_f8._4_2_ = (ushort)(sVar63 < sVar26) * sVar26 | (ushort)(sVar63 >= sVar26) * sVar63;
  local_f8._6_2_ = (ushort)(sVar71 < sVar27) * sVar27 | (ushort)(sVar71 >= sVar27) * sVar71;
  local_f8._8_2_ = (ushort)(sVar2 < sVar28) * sVar28 | (ushort)(sVar2 >= sVar28) * sVar2;
  local_f8._10_2_ = (ushort)(sVar3 < sVar29) * sVar29 | (ushort)(sVar3 >= sVar29) * sVar3;
  local_f8._12_2_ = (ushort)(sVar4 < sVar30) * sVar30 | (ushort)(sVar4 >= sVar30) * sVar4;
  local_f8._14_2_ = (ushort)(sVar5 < sVar31) * sVar31 | (ushort)(sVar5 >= sVar31) * sVar5;
  qcoeff0 = (__m128i *)local_b8;
  local_b8._2_2_ = local_f8._2_2_;
  local_b8._0_2_ = local_f8._0_2_;
  uStack_b4 = local_f8._4_2_;
  uStack_b2 = local_f8._6_2_;
  uStack_b0 = local_f8._8_2_;
  uStack_ae = local_f8._10_2_;
  uStack_ac = local_f8._12_2_;
  uStack_aa = local_f8._14_2_;
  sVar19 = local_118._0_2_;
  sVar70 = -sVar19;
  sVar25 = local_118._2_2_;
  sVar43 = -sVar25;
  sVar26 = local_118._4_2_;
  sVar63 = -sVar26;
  sVar27 = local_118._6_2_;
  sVar71 = -sVar27;
  sVar28 = local_118._8_2_;
  sVar2 = -sVar28;
  sVar29 = local_118._10_2_;
  sVar3 = -sVar29;
  sVar30 = local_118._12_2_;
  sVar4 = -sVar30;
  sVar31 = local_118._14_2_;
  sVar5 = -sVar31;
  local_108._0_2_ = (ushort)(sVar70 < sVar19) * sVar19 | (ushort)(sVar70 >= sVar19) * sVar70;
  local_108._2_2_ = (ushort)(sVar43 < sVar25) * sVar25 | (ushort)(sVar43 >= sVar25) * sVar43;
  local_108._4_2_ = (ushort)(sVar63 < sVar26) * sVar26 | (ushort)(sVar63 >= sVar26) * sVar63;
  local_108._6_2_ = (ushort)(sVar71 < sVar27) * sVar27 | (ushort)(sVar71 >= sVar27) * sVar71;
  local_108._8_2_ = (ushort)(sVar2 < sVar28) * sVar28 | (ushort)(sVar2 >= sVar28) * sVar2;
  local_108._10_2_ = (ushort)(sVar3 < sVar29) * sVar29 | (ushort)(sVar3 >= sVar29) * sVar3;
  local_108._12_2_ = (ushort)(sVar4 < sVar30) * sVar30 | (ushort)(sVar4 >= sVar30) * sVar4;
  local_108._14_2_ = (ushort)(sVar5 < sVar31) * sVar31 | (ushort)(sVar5 >= sVar31) * sVar5;
  qcoeff1 = (__m128i *)local_98;
  local_98._2_2_ = local_108._2_2_;
  local_98._0_2_ = local_108._0_2_;
  uStack_94 = local_108._4_2_;
  uStack_92 = local_108._6_2_;
  uStack_90 = local_108._8_2_;
  uStack_8e = local_108._10_2_;
  uStack_8c = local_108._12_2_;
  uStack_8a = local_108._14_2_;
  piVar15 = &is_found0;
  palVar16 = &mask0;
  piVar12 = iscan;
  local_80 = n_coeffs;
  threshold[1] = _local_148;
  update_mask0(qcoeff0,qcoeff1,threshold,iscan,piVar15,palVar16);
  auVar20._0_2_ = -(ushort)(local_f8._0_2_ < (short)local_168._0_2_);
  auVar20._2_2_ = -(ushort)(local_f8._2_2_ < (short)local_168._2_2_);
  auVar20._4_2_ = -(ushort)(local_f8._4_2_ < (short)local_168._4_2_);
  auVar20._6_2_ = -(ushort)(local_f8._6_2_ < (short)local_168._6_2_);
  auVar20._8_2_ = -(ushort)(local_f8._8_2_ < (short)local_168._8_2_);
  auVar20._10_2_ = -(ushort)(local_f8._10_2_ < (short)local_168._10_2_);
  auVar20._12_2_ = -(ushort)(local_f8._12_2_ < (short)local_168._12_2_);
  auVar20._14_2_ = -(ushort)(local_f8._14_2_ < (short)local_168._14_2_);
  auVar32._8_4_ = 0xffffffff;
  auVar32._0_8_ = 0xffffffffffffffff;
  auVar32._12_4_ = 0xffffffff;
  local_68 = local_168._8_2_ + -1;
  sStack_66 = local_168._10_2_ + -1;
  sStack_64 = local_168._12_2_ + -1;
  sStack_62 = local_168._14_2_ + -1;
  sStack_60 = local_168._8_2_ + -1;
  sStack_5e = local_168._10_2_ + -1;
  sStack_5c = local_168._12_2_ + -1;
  sStack_5a = local_168._14_2_ + -1;
  auVar77._0_2_ = -(ushort)(local_68 < local_108._0_2_);
  auVar77._2_2_ = -(ushort)(sStack_66 < local_108._2_2_);
  auVar77._4_2_ = -(ushort)(sStack_64 < local_108._4_2_);
  auVar77._6_2_ = -(ushort)(sStack_62 < local_108._6_2_);
  auVar77._8_2_ = -(ushort)(sStack_60 < local_108._8_2_);
  auVar77._10_2_ = -(ushort)(sStack_5e < local_108._10_2_);
  auVar77._12_2_ = -(ushort)(sStack_5c < local_108._12_2_);
  auVar77._14_2_ = -(ushort)(sStack_5a < local_108._14_2_);
  auVar44 = auVar77 | auVar20 ^ auVar32;
  uVar42 = (ushort)(SUB161(auVar44 >> 7,0) & 1) | (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar44[0xf] >> 7) << 0xf
  ;
  local_170 = (uint)CONCAT11((char)(uVar42 >> 8),uVar42 == 0);
  if (uVar42 == 0) {
    threshold[0][0] = (longlong)local_148;
    threshold[0][1] = _uStack_140;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    local_f8._4_4_ = local_e8._4_4_;
    local_f8._0_4_ = local_e8._8_4_;
    local_f8._8_4_ = local_e8._8_4_;
    local_f8._12_4_ = local_e8._4_4_;
    local_108._4_4_ = local_138._4_4_;
    local_108._0_4_ = local_138._8_4_;
    local_108._8_4_ = local_138._8_4_;
    local_108._12_4_ = local_138._4_4_;
    local_118._4_4_ = local_d8._4_4_;
    local_118._0_4_ = local_d8._8_4_;
    local_118._8_4_ = local_d8._8_4_;
    local_118._12_4_ = local_d8._4_4_;
    local_148._4_4_ = uStack_154;
    local_148._0_4_ = uStack_150;
    uStack_140 = uStack_150;
    uStack_13c = uStack_154;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar73 = psraw(local_78,0xf);
    auVar44 = (auVar20 ^ auVar32) & *(undefined1 (*) [16])iscan;
    auVar72 = psraw(local_118,0xf);
    auVar32 = *(undefined1 (*) [16])(iscan + 8) & auVar77;
    sVar70 = auVar44._0_2_;
    sVar43 = auVar32._0_2_;
    uVar42 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._2_2_;
    sVar43 = auVar32._2_2_;
    uVar56 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._4_2_;
    sVar43 = auVar32._4_2_;
    uVar57 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._6_2_;
    sVar43 = auVar32._6_2_;
    uVar58 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._8_2_;
    sVar43 = auVar32._8_2_;
    uVar59 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._10_2_;
    sVar43 = auVar32._10_2_;
    uVar60 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._12_2_;
    sVar43 = auVar32._12_2_;
    sVar63 = auVar32._14_2_;
    uVar61 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
    sVar70 = auVar44._14_2_;
    uVar62 = (ushort)(sVar63 < sVar70) * sVar70 | (ushort)(sVar63 >= sVar70) * sVar63;
    local_168._2_2_ = (0 < (short)uVar56) * uVar56;
    local_168._0_2_ = (0 < (short)uVar42) * uVar42;
    local_168._4_2_ = (0 < (short)uVar57) * uVar57;
    local_168._6_2_ = (0 < (short)uVar58) * uVar58;
    local_168._8_2_ = (0 < (short)uVar59) * uVar59;
    local_168._10_2_ = (0 < (short)uVar60) * uVar60;
    local_168._12_2_ = (0 < (short)uVar61) * uVar61;
    local_168._14_2_ = (0 < (short)uVar62) * uVar62;
    threshold[0][0] = (longlong)local_148;
    threshold[0][1] = _uStack_140;
    auVar32 = paddsw(local_f8,local_e8);
    auVar44 = pmulhw(auVar32,local_138);
    auVar33._0_2_ = auVar44._0_2_ + auVar32._0_2_;
    auVar33._2_2_ = auVar44._2_2_ + auVar32._2_2_;
    auVar33._4_2_ = auVar44._4_2_ + auVar32._4_2_;
    auVar33._6_2_ = auVar44._6_2_ + auVar32._6_2_;
    auVar33._8_2_ = auVar44._8_2_ + auVar32._8_2_;
    auVar33._10_2_ = auVar44._10_2_ + auVar32._10_2_;
    auVar33._12_2_ = auVar44._12_2_ + auVar32._12_2_;
    auVar33._14_2_ = auVar44._14_2_ + auVar32._14_2_;
    sVar70 = local_d8._8_2_;
    sVar43 = local_d8._10_2_;
    sVar63 = local_d8._12_2_;
    sVar71 = local_d8._14_2_;
    auVar44 = pmulhw(auVar33,local_d8);
    auVar45._0_2_ = (ushort)(auVar33._0_2_ * local_d8._0_2_) >> 0xf;
    auVar45._2_2_ = (ushort)(auVar33._2_2_ * local_d8._2_2_) >> 0xf;
    auVar45._4_2_ = (ushort)(auVar33._4_2_ * local_d8._4_2_) >> 0xf;
    auVar45._6_2_ = (ushort)(auVar33._6_2_ * local_d8._6_2_) >> 0xf;
    auVar45._8_2_ = (ushort)(auVar33._8_2_ * sVar70) >> 0xf;
    auVar45._10_2_ = (ushort)(auVar33._10_2_ * sVar43) >> 0xf;
    auVar45._12_2_ = (ushort)(auVar33._12_2_ * sVar63) >> 0xf;
    auVar45._14_2_ = (ushort)(auVar33._14_2_ * sVar71) >> 0xf;
    auVar34._2_2_ = auVar44._2_2_ * 2;
    auVar34._0_2_ = auVar44._0_2_ * 2;
    auVar34._4_2_ = auVar44._4_2_ * 2;
    auVar34._6_2_ = auVar44._6_2_ * 2;
    auVar34._8_2_ = auVar44._8_2_ * 2;
    auVar34._10_2_ = auVar44._10_2_ * 2;
    auVar34._12_2_ = auVar44._12_2_ * 2;
    auVar34._14_2_ = auVar44._14_2_ * 2;
    _local_b8 = (__m128i)(auVar34 | auVar45);
    local_f8._0_8_ = local_e8._8_8_;
    local_f8._8_4_ = local_e8._8_4_;
    local_f8._12_4_ = local_e8._12_4_;
    auVar64._12_4_ = local_138._12_4_;
    auVar64._0_8_ = local_138._8_8_;
    auVar64._8_4_ = local_138._8_4_;
    local_118._12_4_ = local_d8._12_4_;
    local_118._0_8_ = local_d8._8_8_;
    local_118._8_4_ = local_d8._8_4_;
    auVar32 = paddsw(local_108,local_f8);
    auVar44 = pmulhw(auVar32,auVar64);
    auVar74._0_2_ = auVar44._0_2_ + auVar32._0_2_;
    auVar74._2_2_ = auVar44._2_2_ + auVar32._2_2_;
    auVar74._4_2_ = auVar44._4_2_ + auVar32._4_2_;
    auVar74._6_2_ = auVar44._6_2_ + auVar32._6_2_;
    auVar74._8_2_ = auVar44._8_2_ + auVar32._8_2_;
    auVar74._10_2_ = auVar44._10_2_ + auVar32._10_2_;
    auVar74._12_2_ = auVar44._12_2_ + auVar32._12_2_;
    auVar74._14_2_ = auVar44._14_2_ + auVar32._14_2_;
    auVar44 = pmulhw(auVar74,local_118);
    auVar46._0_2_ = (ushort)(auVar74._0_2_ * sVar70) >> 0xf;
    auVar46._2_2_ = (ushort)(auVar74._2_2_ * sVar43) >> 0xf;
    auVar46._4_2_ = (ushort)(auVar74._4_2_ * sVar63) >> 0xf;
    auVar46._6_2_ = (ushort)(auVar74._6_2_ * sVar71) >> 0xf;
    auVar46._8_2_ = (ushort)(auVar74._8_2_ * sVar70) >> 0xf;
    auVar46._10_2_ = (ushort)(auVar74._10_2_ * sVar43) >> 0xf;
    auVar46._12_2_ = (ushort)(auVar74._12_2_ * sVar63) >> 0xf;
    auVar46._14_2_ = (ushort)(auVar74._14_2_ * sVar71) >> 0xf;
    auVar75._2_2_ = auVar44._2_2_ * 2;
    auVar75._0_2_ = auVar44._0_2_ * 2;
    auVar75._4_2_ = auVar44._4_2_ * 2;
    auVar75._6_2_ = auVar44._6_2_ * 2;
    auVar75._8_2_ = auVar44._8_2_ * 2;
    auVar75._10_2_ = auVar44._10_2_ * 2;
    auVar75._12_2_ = auVar44._12_2_ * 2;
    auVar75._14_2_ = auVar44._14_2_ * 2;
    auVar44 = (undefined1  [16])_local_b8 ^ auVar73;
    auVar21._0_2_ = auVar44._0_2_ - auVar73._0_2_;
    auVar21._2_2_ = auVar44._2_2_ - auVar73._2_2_;
    auVar21._4_2_ = auVar44._4_2_ - auVar73._4_2_;
    auVar21._6_2_ = auVar44._6_2_ - auVar73._6_2_;
    auVar21._8_2_ = auVar44._8_2_ - auVar73._8_2_;
    auVar21._10_2_ = auVar44._10_2_ - auVar73._10_2_;
    auVar21._12_2_ = auVar44._12_2_ - auVar73._12_2_;
    auVar21._14_2_ = auVar44._14_2_ - auVar73._14_2_;
    auVar44 = (auVar75 | auVar46) ^ auVar72;
    auVar76._0_2_ = auVar44._0_2_ - auVar72._0_2_;
    auVar76._2_2_ = auVar44._2_2_ - auVar72._2_2_;
    auVar76._4_2_ = auVar44._4_2_ - auVar72._4_2_;
    auVar76._6_2_ = auVar44._6_2_ - auVar72._6_2_;
    auVar76._8_2_ = auVar44._8_2_ - auVar72._8_2_;
    auVar76._10_2_ = auVar44._10_2_ - auVar72._10_2_;
    auVar76._12_2_ = auVar44._12_2_ - auVar72._12_2_;
    auVar76._14_2_ = auVar44._14_2_ - auVar72._14_2_;
    auVar21 = ~auVar20 & auVar21;
    local_138 = auVar76 & auVar77;
    auVar20 = psraw(auVar21,0xf);
    auVar73._0_12_ = auVar21._0_12_;
    auVar73._12_2_ = auVar21._6_2_;
    auVar73._14_2_ = auVar20._6_2_;
    auVar72._12_4_ = auVar73._12_4_;
    auVar72._0_10_ = auVar21._0_10_;
    auVar72._10_2_ = auVar20._4_2_;
    auVar36._10_6_ = auVar72._10_6_;
    auVar36._0_8_ = auVar21._0_8_;
    auVar36._8_2_ = auVar21._4_2_;
    auVar35._8_8_ = auVar36._8_8_;
    auVar35._6_2_ = auVar20._2_2_;
    auVar35._4_2_ = auVar21._2_2_;
    auVar35._0_2_ = auVar21._0_2_;
    auVar35._2_2_ = auVar20._0_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar35;
    *(short *)(qcoeff_ptr + 4) = auVar21._8_2_;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar20._8_2_;
    *(short *)(qcoeff_ptr + 5) = auVar21._10_2_;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar20._10_2_;
    *(short *)(qcoeff_ptr + 6) = auVar21._12_2_;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar20._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar21._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar20._14_2_;
    auVar20 = psraw(local_138,0xf);
    auVar40._0_12_ = local_138._0_12_;
    auVar40._12_2_ = local_138._6_2_;
    auVar40._14_2_ = auVar20._6_2_;
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_10_ = local_138._0_10_;
    auVar39._10_2_ = auVar20._4_2_;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._0_8_ = local_138._0_8_;
    auVar38._8_2_ = local_138._4_2_;
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._6_2_ = auVar20._2_2_;
    auVar37._4_2_ = local_138._2_2_;
    auVar37._0_2_ = local_138._0_2_;
    auVar37._2_2_ = auVar20._0_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar37;
    *(short *)(qcoeff_ptr + 0xc) = local_138._8_2_;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar20._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = local_138._10_2_;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar20._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = local_138._12_2_;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar20._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = local_138._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar20._14_2_;
    qcoeff1 = (__m128i *)&log_scale;
    qcoeff[1] = (longlong)qcoeff1;
    qcoeff[0] = (longlong)dqcoeff_ptr;
    dequant[1] = (longlong)piVar12;
    dequant[0] = extraout_RDX;
    zero[1] = (longlong)palVar16;
    zero[0] = (longlong)piVar15;
    local_108 = auVar64;
    calculate_dqcoeff_and_store_log_scale
              (qcoeff,dequant,zero,(tran_low_t *)CONCAT44(is_found0,uStack_178),
               (int *)CONCAT44(log_scale,local_170));
    qcoeff0 = (__m128i *)(dqcoeff_ptr + 8);
    local_148._4_4_ = uStack_154;
    local_148._0_4_ = uStack_150;
    uStack_140 = uStack_150;
    uStack_13c = uStack_154;
    qcoeff_00[1] = (longlong)qcoeff1;
    qcoeff_00[0] = (longlong)qcoeff0;
    dequant_00[1] = (longlong)piVar12;
    dequant_00[0] = extraout_RDX_00;
    zero_00[1] = (longlong)palVar16;
    zero_00[0] = (longlong)piVar15;
    calculate_dqcoeff_and_store_log_scale
              (qcoeff_00,dequant_00,zero_00,(tran_low_t *)CONCAT44(is_found0,uStack_178),
               (int *)CONCAT44(log_scale,local_170));
  }
  lVar10 = 0x10;
LAB_002c9b37:
  lVar17 = (long)(int)lVar10;
  ptVar14 = dqcoeff_ptr + lVar17;
  lVar18 = lVar17 * 2;
  while( true ) {
    lVar10 = lVar17 + 0x10;
    if (local_80 <= lVar17) break;
    local_d8 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar17),
                        *(undefined1 (*) [16])(coeff_ptr + lVar17 + 4));
    local_e8 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar17 + 8),
                        *(undefined1 (*) [16])(coeff_ptr + lVar17 + 0xc));
    sVar19 = local_d8._0_2_;
    sVar70 = -sVar19;
    sVar25 = local_d8._2_2_;
    sVar43 = -sVar25;
    sVar26 = local_d8._4_2_;
    sVar63 = -sVar26;
    sVar27 = local_d8._6_2_;
    sVar71 = -sVar27;
    sVar28 = local_d8._8_2_;
    sVar2 = -sVar28;
    sVar29 = local_d8._10_2_;
    sVar3 = -sVar29;
    sVar30 = local_d8._12_2_;
    sVar4 = -sVar30;
    sVar31 = local_d8._14_2_;
    sVar5 = -sVar31;
    local_158._0_2_ = (ushort)(sVar70 < sVar19) * sVar19 | (ushort)(sVar70 >= sVar19) * sVar70;
    local_158._2_2_ = (ushort)(sVar43 < sVar25) * sVar25 | (ushort)(sVar43 >= sVar25) * sVar43;
    uStack_154._0_2_ = (ushort)(sVar63 < sVar26) * sVar26 | (ushort)(sVar63 >= sVar26) * sVar63;
    uStack_154._2_2_ = (ushort)(sVar71 < sVar27) * sVar27 | (ushort)(sVar71 >= sVar27) * sVar71;
    uStack_150._0_2_ = (ushort)(sVar2 < sVar28) * sVar28 | (ushort)(sVar2 >= sVar28) * sVar2;
    uStack_150._2_2_ = (ushort)(sVar3 < sVar29) * sVar29 | (ushort)(sVar3 >= sVar29) * sVar3;
    uStack_14c = (ushort)(sVar4 < sVar30) * sVar30 | (ushort)(sVar4 >= sVar30) * sVar4;
    uStack_14a = (ushort)(sVar5 < sVar31) * sVar31 | (ushort)(sVar5 >= sVar31) * sVar5;
    local_b8._2_2_ = local_158._2_2_;
    local_b8._0_2_ = local_158._0_2_;
    uStack_b4 = (ushort)uStack_154;
    uStack_b2 = uStack_154._2_2_;
    uStack_b0 = (ushort)uStack_150;
    uStack_ae = uStack_150._2_2_;
    uStack_ac = uStack_14c;
    uStack_aa = uStack_14a;
    sVar19 = local_e8._0_2_;
    sVar70 = -sVar19;
    sVar25 = local_e8._2_2_;
    sVar43 = -sVar25;
    sVar26 = local_e8._4_2_;
    sVar63 = -sVar26;
    sVar27 = local_e8._6_2_;
    sVar71 = -sVar27;
    sVar28 = local_e8._8_2_;
    sVar2 = -sVar28;
    sVar29 = local_e8._10_2_;
    sVar3 = -sVar29;
    sVar30 = local_e8._12_2_;
    sVar4 = -sVar30;
    sVar31 = local_e8._14_2_;
    sVar5 = -sVar31;
    local_138._0_2_ = (ushort)(sVar70 < sVar19) * sVar19 | (ushort)(sVar70 >= sVar19) * sVar70;
    local_138._2_2_ = (ushort)(sVar43 < sVar25) * sVar25 | (ushort)(sVar43 >= sVar25) * sVar43;
    local_138._4_2_ = (ushort)(sVar63 < sVar26) * sVar26 | (ushort)(sVar63 >= sVar26) * sVar63;
    local_138._6_2_ = (ushort)(sVar71 < sVar27) * sVar27 | (ushort)(sVar71 >= sVar27) * sVar71;
    local_138._8_2_ = (ushort)(sVar2 < sVar28) * sVar28 | (ushort)(sVar2 >= sVar28) * sVar2;
    local_138._10_2_ = (ushort)(sVar3 < sVar29) * sVar29 | (ushort)(sVar3 >= sVar29) * sVar3;
    local_138._12_2_ = (ushort)(sVar4 < sVar30) * sVar30 | (ushort)(sVar4 >= sVar30) * sVar4;
    local_138._14_2_ = (ushort)(sVar5 < sVar31) * sVar31 | (ushort)(sVar5 >= sVar31) * sVar5;
    local_98._2_2_ = local_138._2_2_;
    local_98._0_2_ = local_138._0_2_;
    uStack_94 = local_138._4_2_;
    uStack_92 = local_138._6_2_;
    uStack_90 = local_138._8_2_;
    uStack_8e = local_138._10_2_;
    uStack_8c = local_138._12_2_;
    uStack_8a = local_138._14_2_;
    piVar12 = (int16_t *)((long)iscan + lVar18);
    qcoeff0 = (__m128i *)local_b8;
    qcoeff1 = (__m128i *)local_98;
    piVar15 = &is_found0;
    palVar16 = &mask0;
    update_mask0(qcoeff0,qcoeff1,threshold,piVar12,piVar15,palVar16);
    auVar47._0_2_ = -(ushort)(local_68 < local_158._0_2_);
    auVar47._2_2_ = -(ushort)(sStack_66 < local_158._2_2_);
    auVar47._4_2_ = -(ushort)(sStack_64 < local_158._4_2_);
    auVar47._6_2_ = -(ushort)(sStack_62 < local_158._6_2_);
    auVar47._8_2_ = -(ushort)(sStack_60 < local_158._8_2_);
    auVar47._10_2_ = -(ushort)(sStack_5e < local_158._10_2_);
    auVar47._12_2_ = -(ushort)(sStack_5c < local_158._12_2_);
    auVar47._14_2_ = -(ushort)(sStack_5a < local_158._14_2_);
    auVar41._0_2_ = -(ushort)(local_68 < local_138._0_2_);
    auVar41._2_2_ = -(ushort)(sStack_66 < local_138._2_2_);
    auVar41._4_2_ = -(ushort)(sStack_64 < local_138._4_2_);
    auVar41._6_2_ = -(ushort)(sStack_62 < local_138._6_2_);
    auVar41._8_2_ = -(ushort)(sStack_60 < local_138._8_2_);
    auVar41._10_2_ = -(ushort)(sStack_5e < local_138._10_2_);
    auVar41._12_2_ = -(ushort)(sStack_5c < local_138._12_2_);
    auVar41._14_2_ = -(ushort)(sStack_5a < local_138._14_2_);
    auVar20 = auVar41 | auVar47;
    if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar20[0xf] < '\0')
    goto LAB_002c9c8b;
    local_168._0_2_ = (ushort)(-1 < (short)local_168._0_2_) * local_168._0_2_;
    local_168._2_2_ = (ushort)(-1 < (short)local_168._2_2_) * local_168._2_2_;
    local_168._4_2_ = (ushort)(-1 < (short)local_168._4_2_) * local_168._4_2_;
    local_168._6_2_ = (ushort)(-1 < (short)local_168._6_2_) * local_168._6_2_;
    local_168._8_2_ = (ushort)(-1 < (short)local_168._8_2_) * local_168._8_2_;
    local_168._10_2_ = (ushort)(-1 < (short)local_168._10_2_) * local_168._10_2_;
    local_168._12_2_ = (ushort)(-1 < (short)local_168._12_2_) * local_168._12_2_;
    local_168._14_2_ = (ushort)(-1 < (short)local_168._14_2_) * local_168._14_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar17 + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar17 + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar17 + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + lVar17) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar17 + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar17 + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar17 + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + lVar17) = (undefined1  [16])0x0;
    ptVar14 = ptVar14 + 0x10;
    lVar18 = lVar18 + 0x20;
    lVar17 = lVar10;
  }
  if (is_found0 == 0) {
    uVar7 = 0;
  }
  else {
    mask[1] = (longlong)qcoeff1;
    mask[0] = (longlong)qcoeff0;
    uVar7 = calculate_non_zero_count(mask);
  }
  if ((local_170 & 1) == 0) {
    mask_00[1] = (longlong)qcoeff1;
    mask_00[0] = (longlong)qcoeff0;
    iVar8 = calculate_non_zero_count(mask_00);
    uVar9 = iVar8 - 1;
  }
  else {
    uVar9 = 0xffffffff;
  }
  for (; (int)uVar7 <= (int)uVar9; uVar9 = uVar9 - 1) {
    sVar70 = scan[uVar9];
    qcoeff_ptr[sVar70] = 0;
    dqcoeff_ptr[sVar70] = 0;
  }
  uVar9 = uVar7 + 1;
  uVar13 = (ulong)uVar7;
  do {
    if ((long)uVar13 < 1) {
      uVar9 = 0;
      break;
    }
    lVar10 = uVar13 - 1;
    uVar13 = uVar13 - 1;
    uVar9 = uVar9 - 1;
  } while (qcoeff_ptr[scan[lVar10]] == 0);
  *eob_ptr = (uint16_t)uVar9;
  uVar13 = 0;
  uVar11 = 0xffffffff;
  do {
    if (uVar7 == uVar13) {
LAB_002c9e9f:
      if (((uint16_t)uVar9 != 0) && (uVar11 == (uVar9 & 0xffff) - 1)) {
        sVar70 = scan[uVar11];
        if (((qcoeff_ptr[sVar70] == 1) || (qcoeff_ptr[sVar70] == -1)) &&
           (uVar7 = coeff_ptr[sVar70] >> 0x1f,
           (int)((coeff_ptr[sVar70] << 5 ^ uVar7) - uVar7) <
           *(int *)(local_118 + (ulong)(sVar70 != 0) * 4 + -8) * 0x20 +
           (dequant_ptr[sVar70 != 0] * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar70] = 0;
          dqcoeff_ptr[sVar70] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar13]] != 0) {
      uVar11 = (uint)uVar13;
      goto LAB_002c9e9f;
    }
    uVar13 = uVar13 + 1;
  } while( true );
LAB_002c9c8b:
  auVar32 = psraw(local_d8,0xf);
  auVar77 = psraw(local_e8,0xf);
  auVar20 = *(undefined1 (*) [16])(iscan + lVar17) & auVar47;
  auVar44 = *(undefined1 (*) [16])(iscan + lVar17 + 8) & auVar41;
  sVar70 = auVar20._0_2_;
  sVar43 = auVar44._0_2_;
  uVar42 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._2_2_;
  sVar43 = auVar44._2_2_;
  uVar56 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._4_2_;
  sVar43 = auVar44._4_2_;
  uVar57 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._6_2_;
  sVar43 = auVar44._6_2_;
  uVar58 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._8_2_;
  sVar43 = auVar44._8_2_;
  uVar59 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._10_2_;
  sVar43 = auVar44._10_2_;
  uVar60 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._12_2_;
  sVar43 = auVar44._12_2_;
  sVar63 = auVar44._14_2_;
  uVar61 = (ushort)(sVar43 < sVar70) * sVar70 | (ushort)(sVar43 >= sVar70) * sVar43;
  sVar70 = auVar20._14_2_;
  uVar62 = (ushort)(sVar63 < sVar70) * sVar70 | (ushort)(sVar63 >= sVar70) * sVar63;
  local_168._2_2_ =
       ((short)local_168._2_2_ < (short)uVar56) * uVar56 |
       (ushort)((short)local_168._2_2_ >= (short)uVar56) * local_168._2_2_;
  local_168._0_2_ =
       ((short)local_168._0_2_ < (short)uVar42) * uVar42 |
       (ushort)((short)local_168._0_2_ >= (short)uVar42) * local_168._0_2_;
  local_168._4_2_ =
       ((short)local_168._4_2_ < (short)uVar57) * uVar57 |
       (ushort)((short)local_168._4_2_ >= (short)uVar57) * local_168._4_2_;
  local_168._6_2_ =
       ((short)local_168._6_2_ < (short)uVar58) * uVar58 |
       (ushort)((short)local_168._6_2_ >= (short)uVar58) * local_168._6_2_;
  local_168._8_2_ =
       ((short)local_168._8_2_ < (short)uVar59) * uVar59 |
       (ushort)((short)local_168._8_2_ >= (short)uVar59) * local_168._8_2_;
  local_168._10_2_ =
       ((short)local_168._10_2_ < (short)uVar60) * uVar60 |
       (ushort)((short)local_168._10_2_ >= (short)uVar60) * local_168._10_2_;
  local_168._12_2_ =
       ((short)local_168._12_2_ < (short)uVar61) * uVar61 |
       (ushort)((short)local_168._12_2_ >= (short)uVar61) * local_168._12_2_;
  local_168._14_2_ =
       ((short)local_168._14_2_ < (short)uVar62) * uVar62 |
       (ushort)((short)local_168._14_2_ >= (short)uVar62) * local_168._14_2_;
  auVar44 = paddsw((undefined1  [16])_local_158,local_f8);
  auVar20 = pmulhw(auVar44,local_108);
  auVar22._0_2_ = auVar20._0_2_ + auVar44._0_2_;
  auVar22._2_2_ = auVar20._2_2_ + auVar44._2_2_;
  auVar22._4_2_ = auVar20._4_2_ + auVar44._4_2_;
  auVar22._6_2_ = auVar20._6_2_ + auVar44._6_2_;
  auVar22._8_2_ = auVar20._8_2_ + auVar44._8_2_;
  auVar22._10_2_ = auVar20._10_2_ + auVar44._10_2_;
  auVar22._12_2_ = auVar20._12_2_ + auVar44._12_2_;
  auVar22._14_2_ = auVar20._14_2_ + auVar44._14_2_;
  auVar20 = pmulhw(auVar22,local_118);
  auVar65._0_2_ = (ushort)(auVar22._0_2_ * local_118._0_2_) >> 0xf;
  auVar65._2_2_ = (ushort)(auVar22._2_2_ * local_118._2_2_) >> 0xf;
  auVar65._4_2_ = (ushort)(auVar22._4_2_ * local_118._4_2_) >> 0xf;
  auVar65._6_2_ = (ushort)(auVar22._6_2_ * local_118._6_2_) >> 0xf;
  auVar65._8_2_ = (ushort)(auVar22._8_2_ * local_118._8_2_) >> 0xf;
  auVar65._10_2_ = (ushort)(auVar22._10_2_ * local_118._10_2_) >> 0xf;
  auVar65._12_2_ = (ushort)(auVar22._12_2_ * local_118._12_2_) >> 0xf;
  auVar65._14_2_ = (ushort)(auVar22._14_2_ * local_118._14_2_) >> 0xf;
  auVar23._2_2_ = auVar20._2_2_ * 2;
  auVar23._0_2_ = auVar20._0_2_ * 2;
  auVar23._4_2_ = auVar20._4_2_ * 2;
  auVar23._6_2_ = auVar20._6_2_ * 2;
  auVar23._8_2_ = auVar20._8_2_ * 2;
  auVar23._10_2_ = auVar20._10_2_ * 2;
  auVar23._12_2_ = auVar20._12_2_ * 2;
  auVar23._14_2_ = auVar20._14_2_ * 2;
  auVar44 = paddsw(local_138,local_f8);
  auVar20 = pmulhw(auVar44,local_108);
  auVar67._0_2_ = auVar20._0_2_ + auVar44._0_2_;
  auVar67._2_2_ = auVar20._2_2_ + auVar44._2_2_;
  auVar67._4_2_ = auVar20._4_2_ + auVar44._4_2_;
  auVar67._6_2_ = auVar20._6_2_ + auVar44._6_2_;
  auVar67._8_2_ = auVar20._8_2_ + auVar44._8_2_;
  auVar67._10_2_ = auVar20._10_2_ + auVar44._10_2_;
  auVar67._12_2_ = auVar20._12_2_ + auVar44._12_2_;
  auVar67._14_2_ = auVar20._14_2_ + auVar44._14_2_;
  auVar20 = pmulhw(auVar67,local_118);
  auVar66._0_2_ = (ushort)(auVar67._0_2_ * local_118._0_2_) >> 0xf;
  auVar66._2_2_ = (ushort)(auVar67._2_2_ * local_118._2_2_) >> 0xf;
  auVar66._4_2_ = (ushort)(auVar67._4_2_ * local_118._4_2_) >> 0xf;
  auVar66._6_2_ = (ushort)(auVar67._6_2_ * local_118._6_2_) >> 0xf;
  auVar66._8_2_ = (ushort)(auVar67._8_2_ * local_118._8_2_) >> 0xf;
  auVar66._10_2_ = (ushort)(auVar67._10_2_ * local_118._10_2_) >> 0xf;
  auVar66._12_2_ = (ushort)(auVar67._12_2_ * local_118._12_2_) >> 0xf;
  auVar66._14_2_ = (ushort)(auVar67._14_2_ * local_118._14_2_) >> 0xf;
  auVar68._2_2_ = auVar20._2_2_ * 2;
  auVar68._0_2_ = auVar20._0_2_ * 2;
  auVar68._4_2_ = auVar20._4_2_ * 2;
  auVar68._6_2_ = auVar20._6_2_ * 2;
  auVar68._8_2_ = auVar20._8_2_ * 2;
  auVar68._10_2_ = auVar20._10_2_ * 2;
  auVar68._12_2_ = auVar20._12_2_ * 2;
  auVar68._14_2_ = auVar20._14_2_ * 2;
  auVar20 = (auVar23 | auVar65) ^ auVar32;
  auVar24._0_2_ = auVar20._0_2_ - auVar32._0_2_;
  auVar24._2_2_ = auVar20._2_2_ - auVar32._2_2_;
  auVar24._4_2_ = auVar20._4_2_ - auVar32._4_2_;
  auVar24._6_2_ = auVar20._6_2_ - auVar32._6_2_;
  auVar24._8_2_ = auVar20._8_2_ - auVar32._8_2_;
  auVar24._10_2_ = auVar20._10_2_ - auVar32._10_2_;
  auVar24._12_2_ = auVar20._12_2_ - auVar32._12_2_;
  auVar24._14_2_ = auVar20._14_2_ - auVar32._14_2_;
  auVar20 = (auVar68 | auVar66) ^ auVar77;
  auVar69._0_2_ = auVar20._0_2_ - auVar77._0_2_;
  auVar69._2_2_ = auVar20._2_2_ - auVar77._2_2_;
  auVar69._4_2_ = auVar20._4_2_ - auVar77._4_2_;
  auVar69._6_2_ = auVar20._6_2_ - auVar77._6_2_;
  auVar69._8_2_ = auVar20._8_2_ - auVar77._8_2_;
  auVar69._10_2_ = auVar20._10_2_ - auVar77._10_2_;
  auVar69._12_2_ = auVar20._12_2_ - auVar77._12_2_;
  auVar69._14_2_ = auVar20._14_2_ - auVar77._14_2_;
  _local_b8 = (__m128i)(auVar24 & auVar47);
  _local_158 = (__m128i)(auVar69 & auVar41);
  auVar20 = psraw((undefined1  [16])_local_b8,0xf);
  auVar51._0_12_ = local_b8._0_12_;
  auVar51._12_2_ = local_b8._6_2_;
  auVar51._14_2_ = auVar20._6_2_;
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._0_10_ = local_b8._0_10_;
  auVar50._10_2_ = auVar20._4_2_;
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_8_ = local_b8._0_8_;
  auVar49._8_2_ = local_b8._4_2_;
  auVar48._8_8_ = auVar49._8_8_;
  auVar48._6_2_ = auVar20._2_2_;
  auVar48._4_2_ = local_b8._2_2_;
  auVar48._0_2_ = local_b8._0_2_;
  auVar48._2_2_ = auVar20._0_2_;
  *(undefined1 (*) [16])(qcoeff_ptr + lVar17) = auVar48;
  ptVar1 = qcoeff_ptr + lVar17 + 4;
  *(short *)ptVar1 = local_b8._8_2_;
  *(short *)((long)ptVar1 + 2) = auVar20._8_2_;
  *(short *)(ptVar1 + 1) = local_b8._10_2_;
  *(short *)((long)ptVar1 + 6) = auVar20._10_2_;
  *(short *)(ptVar1 + 2) = local_b8._12_2_;
  *(short *)((long)ptVar1 + 10) = auVar20._12_2_;
  *(short *)(ptVar1 + 3) = local_b8._14_2_;
  *(short *)((long)ptVar1 + 0xe) = auVar20._14_2_;
  auVar20 = psraw((undefined1  [16])_local_158,0xf);
  auVar55._0_12_ = local_158._0_12_;
  auVar55._12_2_ = local_158._6_2_;
  auVar55._14_2_ = auVar20._6_2_;
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._0_10_ = local_158._0_10_;
  auVar54._10_2_ = auVar20._4_2_;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._0_8_ = local_158._0_8_;
  auVar53._8_2_ = local_158._4_2_;
  auVar52._8_8_ = auVar53._8_8_;
  auVar52._6_2_ = auVar20._2_2_;
  auVar52._4_2_ = local_158._2_2_;
  auVar52._0_2_ = local_158._0_2_;
  auVar52._2_2_ = auVar20._0_2_;
  *(undefined1 (*) [16])(qcoeff_ptr + lVar17 + 8) = auVar52;
  ptVar1 = qcoeff_ptr + lVar17 + 0xc;
  *(short *)ptVar1 = local_158._8_2_;
  *(short *)((long)ptVar1 + 2) = auVar20._8_2_;
  *(short *)(ptVar1 + 1) = local_158._10_2_;
  *(short *)((long)ptVar1 + 6) = auVar20._10_2_;
  *(short *)(ptVar1 + 2) = local_158._12_2_;
  *(short *)((long)ptVar1 + 10) = auVar20._12_2_;
  *(short *)(ptVar1 + 3) = local_158._14_2_;
  *(short *)((long)ptVar1 + 0xe) = auVar20._14_2_;
  qcoeff1 = (__m128i *)&log_scale;
  qcoeff_01[1] = (longlong)qcoeff1;
  qcoeff_01[0] = (longlong)ptVar14;
  dequant_01[1] = (longlong)piVar12;
  dequant_01[0] = extraout_RDX_01;
  zero_01[1] = (longlong)palVar16;
  zero_01[0] = (longlong)piVar15;
  _local_98 = _local_158;
  calculate_dqcoeff_and_store_log_scale
            (qcoeff_01,dequant_01,zero_01,(tran_low_t *)CONCAT44(is_found0,uStack_178),
             (int *)CONCAT44(log_scale,local_170));
  qcoeff0 = (__m128i *)(ptVar14 + 8);
  qcoeff_02[1] = (longlong)qcoeff1;
  qcoeff_02[0] = (longlong)qcoeff0;
  dequant_02[1] = (longlong)piVar12;
  dequant_02[0] = extraout_RDX_02;
  zero_02[1] = (longlong)palVar16;
  zero_02[0] = (longlong)piVar15;
  calculate_dqcoeff_and_store_log_scale
            (qcoeff_02,dequant_02,zero_02,(tran_low_t *)CONCAT44(is_found0,uStack_178),
             (int *)CONCAT44(log_scale,local_170));
  local_170 = 0;
  goto LAB_002c9b37;
}

Assistant:

void aom_quantize_b_32x32_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  const int log_scale = 1;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i log_scale_vec = _mm_set1_epi16(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, log_scale_vec);
  round = _mm_add_epi16(round, log_scale_vec);
  zbin = _mm_srli_epi16(zbin, log_scale);
  round = _mm_srli_epi16(round, log_scale);
  zbin = _mm_sub_epi16(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);
    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}